

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

Matrix<double> __thiscall Matrix<double>::Inverse(Matrix<double> *this)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  double **ppdVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  double **extraout_RDX;
  int k;
  ulong uVar8;
  ulong uVar9;
  uint *in_RSI;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  int j;
  ulong uVar15;
  long lVar16;
  int columMod;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  Matrix<double> MVar22;
  Matrix<double> A;
  
  Matrix(&A,*in_RSI,*in_RSI * 2);
  uVar1 = *in_RSI;
  uVar11 = (ulong)uVar1;
  lVar6 = (long)(int)uVar1;
  uVar10 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  for (; uVar10 != uVar7; uVar10 = uVar10 + 1) {
    lVar16 = *(long *)(in_RSI + 2);
    for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
      A.M[uVar10][uVar15] = *(double *)(*(long *)(lVar16 + uVar10 * 8) + uVar15 * 8);
    }
  }
  for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
    A.M[uVar10][lVar6 + uVar10] = 1.0;
  }
  uVar5 = uVar1 * 2;
  uVar10 = 1;
  lVar16 = 0;
  lVar17 = 0;
  uVar15 = 0;
  while( true ) {
    uVar18 = (ulong)uVar5;
    if ((int)uVar5 < (int)uVar15) {
      uVar18 = uVar15 & 0xffffffff;
    }
    if (uVar15 == uVar7) break;
    pdVar2 = A.M[uVar15];
    dVar20 = ABS(pdVar2[uVar15]);
    uVar8 = uVar15 & 0xffffffff;
    for (uVar9 = uVar10; (int)uVar9 < (int)uVar1; uVar9 = uVar9 + 1) {
      dVar21 = ABS(A.M[uVar9][uVar15]);
      uVar19 = -(ulong)(dVar20 < dVar21);
      if (dVar20 < dVar21) {
        uVar8 = uVar9 & 0xffffffff;
      }
      dVar20 = (double)(~uVar19 & (ulong)dVar20 | (ulong)A.M[uVar9][uVar15] & uVar19);
    }
    for (uVar9 = uVar15; uVar19 = uVar10, uVar18 != uVar9; uVar9 = uVar9 + 1) {
      dVar20 = A.M[(int)uVar8][uVar9];
      A.M[(int)uVar8][uVar9] = pdVar2[uVar9];
      pdVar2[uVar9] = dVar20;
    }
    for (; (int)uVar19 < (int)uVar1; uVar19 = uVar19 + 1) {
      pdVar3 = A.M[uVar19];
      dVar20 = pdVar3[uVar15];
      dVar21 = pdVar2[uVar15];
      for (lVar14 = 0; lVar17 + uVar18 != lVar14; lVar14 = lVar14 + 1) {
        if (lVar14 == 0) {
          pdVar3[uVar15] = 0.0;
        }
        else {
          *(double *)((long)pdVar3 + lVar14 * 8 + lVar16) =
               *(double *)((long)pdVar2 + lVar14 * 8 + lVar16) * (-dVar20 / dVar21) +
               *(double *)((long)pdVar3 + lVar14 * 8 + lVar16);
        }
      }
    }
    uVar15 = uVar15 + 1;
    uVar10 = uVar10 + 1;
    lVar17 = lVar17 + -1;
    lVar16 = lVar16 + 8;
  }
  while (iVar12 = (int)uVar11, 0 < iVar12) {
    uVar11 = uVar11 - 1;
    for (lVar16 = lVar6; lVar16 < (int)uVar5; lVar16 = lVar16 + 1) {
      pdVar2 = A.M[uVar11];
      pdVar2[lVar16] = pdVar2[lVar16] / pdVar2[uVar11];
    }
    for (uVar13 = iVar12 - 2; -1 < (int)uVar13; uVar13 = uVar13 - 1) {
      for (lVar16 = lVar6; lVar16 < (int)uVar5; lVar16 = lVar16 + 1) {
        pdVar2 = A.M[uVar13];
        pdVar2[lVar16] = pdVar2[lVar16] - A.M[uVar11][lVar16] * pdVar2[uVar11];
      }
    }
  }
  Matrix(this,uVar1,uVar1);
  uVar1 = *in_RSI;
  uVar7 = 0;
  uVar11 = 0;
  if (0 < (int)uVar1) {
    uVar11 = (ulong)uVar1;
  }
  for (; uVar7 != uVar11; uVar7 = uVar7 + 1) {
    ppdVar4 = this->M;
    for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
      ppdVar4[uVar7][uVar10] = A.M[uVar7][(long)(int)uVar1 + uVar10];
    }
  }
  ~Matrix(&A);
  MVar22.M = extraout_RDX;
  MVar22._0_8_ = this;
  return MVar22;
}

Assistant:

Matrix Inverse() const {
    Matrix<T> A(n, 2 * n);
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < n; j++) {
        A.M[i][j] = M[i][j];
      }
    }
    for (int i = 0; i < n; i++) {
      A.M[i][n + i] = 1;
    }

    for (int i = 0; i < n; i++) {
      double maxEl = abs(A.M[i][i]);
      int maxRow = i;
      for (int k = i + 1; k < n; k++) {
        if (abs(A.M[k][i]) > maxEl) {
          maxEl = A.M[k][i];
          maxRow = k;
        }
      }

      for (int k = i; k < 2 * n; k++) {
        double tmp = A.M[maxRow][k];
        A.M[maxRow][k] = A.M[i][k];
        A.M[i][k] = tmp;
      }

      for (int k = i + 1; k < n; k++) {
        double c = -A.M[k][i] / A.M[i][i];
        for (int j = i; j < 2 * n; j++) {
          if (i == j) {
            A.M[k][j] = 0;
          } else {
            A.M[k][j] += c * A.M[i][j];
          }
        }
      }
    }

    for (int i = n - 1; i >= 0; i--) {
      for (int k = n; k < 2 * n; k++) {
        A.M[i][k] /= A.M[i][i];
      }
      for (int rowMod = i - 1; rowMod >= 0; rowMod--) {
        for (int columMod = n; columMod < 2 * n; columMod++) {
          A.M[rowMod][columMod] -= A.M[i][columMod] * A.M[rowMod][i];
        }
      }
    }

    Matrix<T> Inv(n, n);
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < n; j++) {
        Inv.M[i][j] = A.M[i][j + n];
      }
    }
    return Inv;
  }